

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_asof_join.cpp
# Opt level: O1

optional_ptr<duckdb::PhysicalOperator,_true> __thiscall
duckdb::PhysicalPlanGenerator::PlanAsOfLoopJoin
          (PhysicalPlanGenerator *this,LogicalComparisonJoin *op,PhysicalOperator *probe,
          PhysicalOperator *build)

{
  iterator iVar1;
  element_type *peVar2;
  __node_base _Var3;
  undefined8 uVar4;
  pointer pLVar5;
  JoinType join_type;
  byte bVar6;
  int iVar7;
  reference pvVar8;
  pointer pLVar9;
  type binder_p;
  reference pvVar10;
  pointer pEVar11;
  Binder *this_00;
  BoundReferenceExpression *pBVar12;
  reference pvVar13;
  tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> tVar14;
  optional_idx oVar15;
  idx_t offset;
  pointer pBVar16;
  undefined4 extraout_var;
  pointer pPVar17;
  PhysicalOperator *pPVar18;
  PhysicalOperator *pPVar19;
  PhysicalOperator *pPVar20;
  const_reference other;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer other_00;
  size_type sVar21;
  Expression *this_01;
  size_type __n;
  ClientContext *pCVar22;
  __node_base *p_Var23;
  undefined8 *puVar24;
  long lVar25;
  optional_ptr<duckdb::BoundAtClause,_true> oVar26;
  size_type __n_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var27;
  LogicalComparisonJoin *pLVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  byte bVar32;
  idx_t probe_cardinality;
  templated_unique_single_t pk;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  groups;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> comp_expr;
  optional_ptr<duckdb::CatalogEntry,_true> arg_min_max_func;
  vector<duckdb::LogicalType,_true> window_types;
  templated_unique_single_t col_ref;
  templated_unique_single_t pk_ref;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  project_list;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  comp_list;
  vector<duckdb::LogicalType,_true> comp_types;
  LogicalType pk_type;
  shared_ptr<duckdb::Binder,_true> binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  aggregates;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  window_select;
  vector<duckdb::LogicalType,_true> aggr_types;
  string arg_min_max;
  JoinCondition nested_cond;
  FunctionBinder function_binder;
  LogicalComparisonJoin join_op;
  EntryLookupInfo function_lookup;
  FunctionBinder local_628;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *local_618;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_610;
  LogicalType local_608;
  LogicalComparisonJoin *local_5e8;
  long *local_5e0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_5d8;
  optional_ptr<duckdb::CatalogEntry,_true> local_5d0;
  LogicalType local_5c8;
  CatalogEntry *local_5b0;
  _Head_base<0UL,_duckdb::BoundReferenceExpression_*,_false> local_5a8;
  _Head_base<0UL,_duckdb::BoundReferenceExpression_*,_false> local_5a0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_598;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_580;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_578;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_558;
  LogicalType local_540;
  undefined1 local_528 [16];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_518;
  undefined1 local_4f8 [16];
  BoundReferenceExpression local_4e8;
  undefined8 *local_478;
  __node_base *local_470;
  Binder *local_468;
  LogicalType *local_460;
  LogicalType *local_458;
  string *local_450;
  PhysicalOperator *local_448;
  PhysicalOperator *local_440;
  __node_base local_438;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_430;
  string local_418;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3f8;
  Expression *pEStack_3f0;
  __node_base local_3e8;
  undefined1 local_3d8 [144];
  LogicalType LStack_348;
  FunctionStability local_330;
  FunctionNullHandling FStack_32f;
  FunctionErrors FStack_32e;
  FunctionCollationHandling FStack_32d;
  __node_base a_Stack_328 [14];
  element_type *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  undefined1 local_2a8 [80];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_258;
  JoinType local_237 [15];
  ClientContext *local_228;
  iterator local_220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  optional_ptr<duckdb::BoundAtClause,_true> local_210;
  iterator local_208;
  __buckets_ptr local_200;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_1e0 [4];
  EntryLookupInfo local_180;
  BaseScalarFunction local_160;
  undefined8 auStack_b0 [14];
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar32 = 0;
  join_type = InverseJoinType((op->super_LogicalJoin).super_LogicalOperator.field_0x61);
  LogicalComparisonJoin::LogicalComparisonJoin
            ((LogicalComparisonJoin *)(local_2a8 + 0x10),join_type,LOGICAL_COMPARISON_JOIN);
  local_618 = &(op->super_LogicalJoin).super_LogicalOperator.children;
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](local_618,1);
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&local_258,
             &(pLVar9->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](local_618,0);
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar8);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType_const*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_258,
             local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pLVar9->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((op->predicate).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
      ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    pPVar19 = (PhysicalOperator *)0x0;
    goto LAB_0045028b;
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
             &(op->super_LogicalJoin).right_projection_map.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  local_5e8 = op;
  if (local_228 == (ClientContext *)local_220._M_current) {
    _Var27._M_head_impl = (Expression *)0x0;
    while( true ) {
      local_3d8._0_8_ = _Var27._M_head_impl;
      pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](local_618,1);
      pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar8);
      if ((ulong)(((long)(pLVar9->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pLVar9->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
          _Var27._M_head_impl) break;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_current == local_218._M_pi) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_228,local_220,
                   (unsigned_long *)local_3d8);
      }
      else {
        *local_220._M_current = local_3d8._0_8_;
        local_220._M_current = local_220._M_current + 1;
      }
      _Var27._M_head_impl =
           (Expression *)
           ((long)&(((Expression *)local_3d8._0_8_)->super_BaseExpression)._vptr_BaseExpression + 1)
      ;
    }
  }
  pLVar28 = local_5e8;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_210,
             &(local_5e8->super_LogicalJoin).left_projection_map.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  if (local_210.ptr == (BoundAtClause *)local_208._M_current) {
    _Var27._M_head_impl = (Expression *)0x0;
    while( true ) {
      local_3d8._0_8_ = _Var27._M_head_impl;
      pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](local_618,0);
      pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar8);
      pLVar28 = local_5e8;
      if ((ulong)(((long)(pLVar9->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pLVar9->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
          _Var27._M_head_impl) break;
      if ((__buckets_ptr)local_208._M_current == local_200) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_210,local_208,
                   (unsigned_long *)local_3d8);
      }
      else {
        *local_208._M_current = local_3d8._0_8_;
        local_208._M_current = local_208._M_current + 1;
      }
      _Var27._M_head_impl = (Expression *)(local_3d8._0_8_ + 1);
    }
  }
  LogicalType::LogicalType(&local_540,BIGINT);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalType&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_258,
             &local_540);
  Binder::CreateBinder
            ((Binder *)local_528,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,
             REGULAR_BINDER);
  local_448 = probe;
  local_440 = build;
  local_438._M_nxt = (_Hash_node_base *)this;
  binder_p = shared_ptr<duckdb::Binder,_true>::operator*
                       ((shared_ptr<duckdb::Binder,_true> *)local_528);
  FunctionBinder::FunctionBinder((FunctionBinder *)local_2a8,binder_p);
  local_610._M_head_impl = (Expression *)&pLVar28->conditions;
  __n = ((long)(pLVar28->conditions).
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(pLVar28->conditions).
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  bVar29 = (pLVar28->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish !=
           (pLVar28->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (bVar29) {
    __n_00 = 0;
    do {
      pvVar10 = vector<duckdb::JoinCondition,_true>::operator[]
                          ((vector<duckdb::JoinCondition,_true> *)local_610._M_head_impl,__n_00);
      local_3d8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      local_3d8._8_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar10->right);
      (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])(local_4f8,pEVar11);
      uVar4 = local_3d8._0_8_;
      local_3d8._0_8_ = local_4f8._0_8_;
      local_4f8._0_8_ = (Expression *)0x0;
      if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)uVar4 !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (**(code **)(*(long *)uVar4 + 8))();
      }
      if ((Expression *)local_4f8._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_4f8._0_8_ + 8))();
      }
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar10->left);
      (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])(local_4f8,pEVar11);
      uVar4 = local_3d8._8_8_;
      local_3d8._8_8_ = local_4f8._0_8_;
      local_4f8._0_8_ = (BoundReferenceExpression *)0x0;
      if ((Expression *)uVar4 != (Expression *)0x0) {
        (*((BaseExpression *)uVar4)->_vptr_BaseExpression[1])();
      }
      if ((BoundReferenceExpression *)local_4f8._0_8_ != (BoundReferenceExpression *)0x0) {
        (**(code **)(*(long *)local_4f8._0_8_ + 8))();
      }
      bVar30 = (BoundReferenceExpression *)local_3d8._0_8_ == (BoundReferenceExpression *)0x0;
      bVar31 = (Expression *)local_3d8._8_8_ == (Expression *)0x0;
      if (!bVar31 && !bVar30) {
        local_3d8[0x10] = FlipComparisonExpression(pvVar10->comparison);
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
        emplace_back<duckdb::JoinCondition>(local_1e0,(JoinCondition *)local_3d8);
        bVar6 = pvVar10->comparison - COMPARE_LESSTHAN;
        if (bVar6 < 4) {
          ::std::__cxx11::string::_M_replace
                    ((ulong)&local_418,0,(char *)local_418._M_string_length,
                     (ulong)(&DAT_01366f50 + *(int *)(&DAT_01366f50 + (ulong)bVar6 * 4)));
          __n = __n_00;
        }
      }
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_3d8._8_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_3d8._8_8_ + 8))();
      }
      local_3d8._8_8_ =
           (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      if ((BoundReferenceExpression *)local_3d8._0_8_ != (BoundReferenceExpression *)0x0) {
        (*(((Expression *)local_3d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      pLVar28 = local_5e8;
      if (bVar31 || bVar30) break;
      __n_00 = __n_00 + 1;
      bVar29 = __n_00 < (ulong)(((long)(local_5e8->conditions).
                                       super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                       .
                                       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_5e8->conditions).
                                       super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                       .
                                       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555);
    } while (bVar29);
  }
  if (bVar29) {
LAB_00450250:
    pPVar19 = (PhysicalOperator *)0x0;
  }
  else {
    pPVar19 = (PhysicalOperator *)0x0;
    if ((local_237[0] < 8) && ((0xecU >> (local_237[0] & 0x1f) & 1) != 0)) {
      bVar29 = PhysicalNestedLoopJoin::IsSupported
                         ((vector<duckdb::JoinCondition,_true> *)local_610._M_head_impl,
                          (pLVar28->super_LogicalJoin).super_LogicalOperator.field_0x61);
      if (bVar29) {
        EntryLookupInfo::EntryLookupInfo
                  (&local_180,SCALAR_FUNCTION_ENTRY,&local_418,(QueryErrorContext)0xffffffffffffffff
                  );
        this_00 = shared_ptr<duckdb::Binder,_true>::operator->
                            ((shared_ptr<duckdb::Binder,_true> *)local_528);
        local_3d8._0_8_ = (Expression *)(local_3d8 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"system","");
        local_4f8._0_8_ = &local_4e8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"main","");
        local_5d0 = Binder::GetCatalogEntry
                              (this_00,(string *)local_3d8,(string *)local_4f8,&local_180,
                               RETURN_NULL);
        if ((BoundReferenceExpression *)local_4f8._0_8_ != &local_4e8) {
          operator_delete((void *)local_4f8._0_8_);
        }
        if ((Expression *)local_3d8._0_8_ != (Expression *)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_);
        }
        if ((local_5d0.ptr != (CatalogEntry *)0x0) &&
           (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_5d0),
           (local_5d0.ptr)->type == AGGREGATE_FUNCTION_ENTRY)) {
          optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_5d0);
          pLVar5 = local_258.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          local_5b0 = local_5d0.ptr;
          local_578.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_578.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_578.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (local_258.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_258.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            other_00 = local_258.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            do {
              lVar25 = (long)local_578.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_578.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              pBVar12 = (BoundReferenceExpression *)operator_new(0x60);
              LogicalType::LogicalType((LogicalType *)local_3d8,other_00);
              BoundReferenceExpression::BoundReferenceExpression
                        (pBVar12,(LogicalType *)local_3d8,lVar25 >> 3);
              local_4f8._0_8_ = pBVar12;
              LogicalType::~LogicalType((LogicalType *)local_3d8);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&local_578,
                         (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                          *)local_4f8);
              if ((BoundReferenceExpression *)local_4f8._0_8_ != (BoundReferenceExpression *)0x0) {
                (**(code **)(*(long *)local_4f8._0_8_ + 8))();
              }
              other_00 = other_00 + 1;
            } while (other_00 != pLVar5);
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_558,&local_258);
          pvVar10 = vector<duckdb::JoinCondition,_true>::operator[]
                              ((vector<duckdb::JoinCondition,_true> *)local_610._M_head_impl,__n);
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(&pvVar10->right);
          (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_5d8,pEVar11);
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_5d8);
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalType&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_558,
                     &pEVar11->return_type);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_578,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_5d8);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_430,1,&local_540,(allocator_type *)local_3d8);
          local_518.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_518.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_518.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_610._M_head_impl = (Expression *)local_208._M_current;
          if (local_210.ptr != (BoundAtClause *)local_208._M_current) {
            local_580._M_head_impl = (Expression *)&PTR__AggregateFunction_01996688;
            oVar26.ptr = local_210.ptr;
            do {
              pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                       ::operator[](local_618,1);
              pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       ::operator->(pvVar8);
              sVar21 = ((long)(pLVar9->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pLVar9->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       + (long)(((BoundReferenceExpression *)oVar26.ptr)->super_Expression).
                               super_BaseExpression._vptr_BaseExpression;
              pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                                  ((vector<duckdb::LogicalType,_true> *)&local_258,sVar21);
              LogicalType::LogicalType((LogicalType *)local_4f8,pvVar13);
              ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
              emplace_back<duckdb::LogicalType_const&>
                        ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                         &local_430,(LogicalType *)local_4f8);
              local_5c8.id_ = INVALID;
              local_5c8.physical_type_ = ~INVALID;
              local_5c8._2_6_ = 0;
              local_5c8.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_5c8.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              tVar14.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   )operator_new(0x60);
              LogicalType::LogicalType((LogicalType *)local_3d8,(LogicalType *)local_4f8);
              BoundReferenceExpression::BoundReferenceExpression
                        ((BoundReferenceExpression *)
                         tVar14.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                         (LogicalType *)local_3d8,sVar21);
              LogicalType::~LogicalType((LogicalType *)local_3d8);
              local_3d8._0_8_ =
                   tVar14.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&local_5c8,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_3d8);
              if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                  local_3d8._0_8_ != (Expression *)0x0) {
                (**(code **)(*(long *)local_3d8._0_8_ + 8))();
              }
              FirstFunctionGetter::GetFunction
                        ((AggregateFunction *)local_3d8,(LogicalType *)local_4f8);
              local_598.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_628.context = (ClientContext *)0x0;
              local_628.binder.ptr._0_1_ = 1;
              make_uniq<duckdb::BoundAggregateExpression,duckdb::AggregateFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr),decltype(nullptr),duckdb::AggregateType>
                        ((duckdb *)&local_608,(AggregateFunction *)local_3d8,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)&local_5c8,(void **)&local_598,&local_628.context,
                         (AggregateType *)&local_628);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&local_518,
                         (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                          *)&local_608);
              if ((Expression *)local_608._0_8_ != (Expression *)0x0) {
                (**(code **)&(((((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                                  *)&((BaseExpression *)local_608._0_8_)->_vptr_BaseExpression)->
                               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               )._M_t.
                               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                             super_BaseExpression).type)();
              }
              local_3d8._0_8_ = local_580._M_head_impl;
              if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
              }
              BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3d8);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         *)&local_5c8);
              LogicalType::~LogicalType((LogicalType *)local_4f8);
              oVar26.ptr = (BoundAtClause *)
                           &(((BoundReferenceExpression *)oVar26.ptr)->super_Expression).
                            super_BaseExpression.type;
            } while (oVar26.ptr != (BoundAtClause *)local_610._M_head_impl);
          }
          local_580._M_head_impl = (Expression *)local_220._M_current;
          if (local_228 != (ClientContext *)local_220._M_current) {
            local_450 = &local_5b0->name;
            local_5b0 = (CatalogEntry *)&local_5b0[1].comment.value_info_;
            local_460 = &local_160.return_type;
            local_458 = &LStack_348;
            local_478 = auStack_b0;
            local_470 = a_Stack_328;
            local_468 = (Binder *)&PTR__BaseScalarFunction_019937c0;
            local_610._M_head_impl = (Expression *)&PTR__AggregateFunction_01996688;
            pCVar22 = local_228;
            do {
              pvVar13 = vector<duckdb::LogicalType,_true>::operator[]
                                  ((vector<duckdb::LogicalType,_true> *)&local_258,
                                   (size_type)
                                   (pCVar22->super_enable_shared_from_this<duckdb::ClientContext>).
                                   __weak_this_.internal.
                                   super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
              LogicalType::LogicalType(&local_5c8,pvVar13);
              ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
              emplace_back<duckdb::LogicalType_const&>
                        ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                         &local_430,&local_5c8);
              local_608._0_8_ = (Expression *)0x0;
              local_608.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_608.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              tVar14.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   )operator_new(0x60);
              LogicalType::LogicalType((LogicalType *)local_3d8,&local_5c8);
              BoundReferenceExpression::BoundReferenceExpression
                        ((BoundReferenceExpression *)
                         tVar14.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                         (LogicalType *)local_3d8,
                         (storage_t)
                         (pCVar22->super_enable_shared_from_this<duckdb::ClientContext>).
                         __weak_this_.internal.
                         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
              LogicalType::~LogicalType((LogicalType *)local_3d8);
              local_3d8._0_8_ =
                   tVar14.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&local_608,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_3d8);
              if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                  local_3d8._0_8_ != (Expression *)0x0) {
                (**(code **)(*(long *)local_3d8._0_8_ + 8))();
              }
              pvVar13 = vector<duckdb::LogicalType,_true>::back
                                  ((vector<duckdb::LogicalType,_true> *)&local_558);
              lVar25 = (long)local_558.
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_558.
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              tVar14.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   )operator_new(0x60);
              LogicalType::LogicalType((LogicalType *)local_3d8,pvVar13);
              BoundReferenceExpression::BoundReferenceExpression
                        ((BoundReferenceExpression *)
                         tVar14.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                         (LogicalType *)local_3d8,(lVar25 >> 3) * -0x5555555555555555 - 1);
              LogicalType::~LogicalType((LogicalType *)local_3d8);
              local_3d8._0_8_ =
                   tVar14.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&local_608,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_3d8);
              if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                  local_3d8._0_8_ != (Expression *)0x0) {
                (**(code **)(*(long *)local_3d8._0_8_ + 8))();
              }
              peVar2 = local_608.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_598.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_598.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_598.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              for (this_01 = (Expression *)local_608._0_8_; this_01 != (Expression *)peVar2;
                  this_01 = (Expression *)&(this_01->super_BaseExpression).type) {
                pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                        *)this_01);
                ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
                emplace_back<duckdb::LogicalType&>
                          ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                           &local_598,&pEVar11->return_type);
              }
              ErrorData::ErrorData((ErrorData *)local_4f8);
              oVar15 = FunctionBinder::BindFunction
                                 ((FunctionBinder *)local_2a8,local_450,
                                  (AggregateFunctionSet *)local_5b0,
                                  (vector<duckdb::LogicalType,_true> *)&local_598,
                                  (ErrorData *)local_4f8);
              local_628.context = (ClientContext *)oVar15;
              if (oVar15.index != 0xffffffffffffffff) {
                offset = optional_idx::GetIndex((optional_idx *)&local_628.context);
                FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
                          ((AggregateFunction *)local_3d8,
                           (FunctionSet<duckdb::AggregateFunction> *)local_5b0,offset);
                SimpleFunction::SimpleFunction
                          (&local_160.super_SimpleFunction,(SimpleFunction *)local_3d8);
                local_160.super_SimpleFunction.super_Function._vptr_Function =
                     (_func_int **)local_468;
                LogicalType::LogicalType(local_460,local_458);
                local_160.stability = local_330;
                local_160.null_handling = FStack_32f;
                local_160.errors = FStack_32e;
                local_160.collation_handling = FStack_32d;
                local_160.super_SimpleFunction.super_Function._vptr_Function =
                     (_func_int **)local_610._M_head_impl;
                p_Var23 = local_470;
                puVar24 = local_478;
                for (lVar25 = 0xd; lVar25 != 0; lVar25 = lVar25 + -1) {
                  *puVar24 = p_Var23->_M_nxt;
                  p_Var23 = p_Var23 + (ulong)bVar32 * -2 + 1;
                  puVar24 = puVar24 + (ulong)bVar32 * -2 + 1;
                }
                *(undefined2 *)(local_478 + 0xd) = *(undefined2 *)&local_470[0xd]._M_nxt;
                local_40 = local_2b8;
                local_38 = local_2b0._M_pi;
                if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
                  }
                }
                local_3f8._M_head_impl = (Expression *)local_608._0_8_;
                pEStack_3f0 = (Expression *)
                              local_608.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                local_3e8._M_nxt =
                     (_Hash_node_base *)
                     local_608.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                local_608._0_8_ = (Expression *)0x0;
                local_608.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_608.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_5e0 = (long *)0x0;
                FunctionBinder::BindAggregateFunction
                          (&local_628,(AggregateFunction *)local_2a8,
                           (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)&local_160,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_3f8,(AggregateType)&local_5e0);
                if (local_5e0 != (long *)0x0) {
                  (**(code **)(*local_5e0 + 8))();
                }
                local_5e0 = (long *)0x0;
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           *)&local_3f8);
                local_160.super_SimpleFunction.super_Function._vptr_Function =
                     (_func_int **)local_610._M_head_impl;
                if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
                }
                BaseScalarFunction::~BaseScalarFunction(&local_160);
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&local_518,
                           (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&local_628);
                if (local_628.binder.ptr != (Binder *)0x0) {
                  (*(code *)((((local_628.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>
                              ).__weak_this_.internal.
                              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            ._M_pi)();
                }
                local_3d8._0_8_ = local_610._M_head_impl;
                if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
                }
                BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3d8);
              }
              ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&local_4e8.super_Expression.return_type);
              if ((pointer)local_4e8.super_Expression.super_BaseExpression.alias._M_string_length !=
                  (pointer)((long)&local_4e8.super_Expression.super_BaseExpression.alias.field_2 + 8
                           )) {
                operator_delete((void *)local_4e8.super_Expression.super_BaseExpression.alias.
                                        _M_string_length);
              }
              if ((ExpressionType *)local_4f8._8_8_ !=
                  &local_4e8.super_Expression.super_BaseExpression.type) {
                operator_delete((void *)local_4f8._8_8_);
              }
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                        ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                         &local_598);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         *)&local_608);
              LogicalType::~LogicalType(&local_5c8);
              if (oVar15.index == 0xffffffffffffffff) {
                pPVar19 = (PhysicalOperator *)0x0;
                goto LAB_00450592;
              }
              pCVar22 = (ClientContext *)
                        &(pCVar22->super_enable_shared_from_this<duckdb::ClientContext>).
                         __weak_this_.internal.
                         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
            } while (pCVar22 != (ClientContext *)local_580._M_head_impl);
          }
          local_4f8._0_8_ = (BoundReferenceExpression *)0x0;
          local_4f8._8_8_ = (element_type *)0x0;
          local_4e8.super_Expression.super_BaseExpression._vptr_BaseExpression = (_func_int **)0x0;
          local_608.id_ = 0x7d;
          local_3d8._0_8_ =
               (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
          local_5c8.id_ = INVALID;
          local_5c8.physical_type_ = ~INVALID;
          local_5c8._2_6_ = 0;
          make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,decltype(nullptr),decltype(nullptr)>
                    ((ExpressionType *)&local_628.context,&local_608,(void **)&local_540,
                     (void **)local_3d8);
          pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                  *)&local_628.context);
          _Var3._M_nxt = local_438._M_nxt;
          pPVar20 = local_440;
          pPVar19 = local_448;
          pBVar16->start = UNBOUNDED_PRECEDING;
          pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                  *)&local_628.context);
          pBVar16->end = CURRENT_ROW_ROWS;
          pBVar16 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                  *)&local_628.context);
          ::std::__cxx11::string::operator=
                    ((string *)&(pBVar16->super_Expression).super_BaseExpression.alias,"row_number")
          ;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::BoundWindowExpression,std::default_delete<duckdb::BoundWindowExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)local_4f8,
                     (unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                      *)&local_628.context);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_5c8
                     ,&(pPVar19->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalType&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_5c8,
                     &local_540);
          pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                   ::operator[](local_618,0);
          pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   ::operator->(pvVar8);
          iVar7 = (*pLVar9->_vptr_LogicalOperator[7])
                            (pLVar9,*(ClientContext **)(_Var3._M_nxt + 0x1d));
          local_628.binder.ptr = (Binder *)CONCAT44(extraout_var,iVar7);
          local_618 = (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                       *)(_Var3._M_nxt + 0x1e);
          pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                    ::operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                                  *)local_618);
          pPVar18 = PhysicalPlan::
                    Make<duckdb::PhysicalStreamingWindow,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                              (pPVar17,(vector<duckdb::LogicalType,_true> *)&local_5c8,
                               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                *)local_4f8,(unsigned_long *)&local_628);
          iVar1._M_current =
               (pPVar18->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (pPVar18->children).
              super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::
            vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
            ::_M_realloc_insert<duckdb::PhysicalOperator&>
                      ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                        *)&pPVar18->children,iVar1,pPVar19);
          }
          else {
            (iVar1._M_current)->_M_data = pPVar19;
            (pPVar18->children).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                    ::operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                                  *)local_618);
          pPVar19 = PhysicalPlan::
                    Make<duckdb::PhysicalNestedLoopJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,unsigned_long&>
                              (pPVar17,(LogicalComparisonJoin *)(local_2a8 + 0x10),pPVar20,pPVar18,
                               (vector<duckdb::JoinCondition,_true> *)local_1e0,local_237,
                               (unsigned_long *)&local_628);
          pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                    ::operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                                  *)local_618);
          pPVar20 = PhysicalPlan::
                    Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                              (pPVar17,(vector<duckdb::LogicalType,_true> *)&local_558,&local_578,
                               (unsigned_long *)&local_628);
          iVar1._M_current =
               (pPVar20->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (pPVar20->children).
              super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::
            vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
            ::_M_realloc_insert<duckdb::PhysicalOperator&>
                      ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                        *)&pPVar20->children,iVar1,pPVar19);
          }
          else {
            (iVar1._M_current)->_M_data = pPVar19;
            (pPVar20->children).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          local_608._0_8_ = (Expression *)0x0;
          local_608.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_608.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_3d8._0_8_ =
               ((long)local_258.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_258.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + -1;
          make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long>
                    ((duckdb *)&local_5a0,&local_540,(unsigned_long *)local_3d8);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_608,
                     (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                      *)&local_5a0);
          pCVar22 = *(ClientContext **)(_Var3._M_nxt + 0x1d);
          pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                    ::operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                                  *)local_618);
          pPVar18 = PhysicalPlan::
                    Make<duckdb::PhysicalHashAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                              (pPVar17,pCVar22,(vector<duckdb::LogicalType,_true> *)&local_430,
                               &local_518,
                               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                *)&local_608,(unsigned_long *)&local_628);
          iVar1._M_current =
               (pPVar18->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (pPVar18->children).
              super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::
            vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
            ::_M_realloc_insert<duckdb::PhysicalOperator&>
                      ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                        *)&pPVar18->children,iVar1,pPVar20);
          }
          else {
            (iVar1._M_current)->_M_data = pPVar20;
            (pPVar18->children).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          local_598.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_598.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_598.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (1 < (ulong)(((long)(pPVar18->types).
                                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 .
                                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pPVar18->types).
                                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 .
                                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555)) {
            sVar21 = 1;
            do {
              other = vector<duckdb::LogicalType,_true>::operator[](&pPVar18->types,sVar21);
              pBVar12 = (BoundReferenceExpression *)operator_new(0x60);
              LogicalType::LogicalType((LogicalType *)local_3d8,other);
              BoundReferenceExpression::BoundReferenceExpression
                        (pBVar12,(LogicalType *)local_3d8,sVar21);
              local_5a8._M_head_impl = pBVar12;
              LogicalType::~LogicalType((LogicalType *)local_3d8);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&local_598,
                         (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                          *)&local_5a8);
              if (local_5a8._M_head_impl != (BoundReferenceExpression *)0x0) {
                (*((local_5a8._M_head_impl)->super_Expression).super_BaseExpression.
                  _vptr_BaseExpression[1])();
              }
              sVar21 = sVar21 + 1;
            } while (sVar21 < (ulong)(((long)(pPVar18->types).
                                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             .
                                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pPVar18->types).
                                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             .
                                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
          pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                    ::operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                                  *)local_618);
          pPVar19 = PhysicalPlan::
                    Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                              (pPVar17,&(local_5e8->super_LogicalJoin).super_LogicalOperator.types,
                               &local_598,(unsigned_long *)&local_628);
          iVar1._M_current =
               (pPVar19->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (pPVar19->children).
              super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::
            vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
            ::_M_realloc_insert<duckdb::PhysicalOperator&>
                      ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                        *)&pPVar19->children,iVar1,pPVar18);
          }
          else {
            (iVar1._M_current)->_M_data = pPVar18;
            (pPVar19->children).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&local_598);
          if (local_5a0._M_head_impl != (BoundReferenceExpression *)0x0) {
            (*((local_5a0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
              [1])();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&local_608);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_5c8
                    );
          if (local_628.context != (ClientContext *)0x0) {
            (*(code *)((((local_628.context)->super_enable_shared_from_this<duckdb::ClientContext>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)local_4f8);
LAB_00450592:
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&local_518);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_430);
          if (local_5d8._M_head_impl != (Expression *)0x0) {
            (*((local_5d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_558);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&local_578);
          goto LAB_00450252;
        }
      }
      goto LAB_00450250;
    }
  }
LAB_00450252:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_);
  }
  LogicalType::~LogicalType(&local_540);
LAB_0045028b:
  LogicalComparisonJoin::~LogicalComparisonJoin((LogicalComparisonJoin *)(local_2a8 + 0x10));
  return (optional_ptr<duckdb::PhysicalOperator,_true>)pPVar19;
}

Assistant:

optional_ptr<PhysicalOperator>
PhysicalPlanGenerator::PlanAsOfLoopJoin(LogicalComparisonJoin &op, PhysicalOperator &probe, PhysicalOperator &build) {

	// Plan a inverse nested loop join, then aggregate the values to choose the optimal match for each probe row.
	// Use a row number primary key to handle duplicate probe values.
	// aggregate the fields to produce at most one match per probe row,
	// then project the columns back into the correct order and drop the primary key.
	//
	//		 ∏ * \ pk
	//		 |
	//		 Γ pk;first(P),arg_xxx(B,inequality)
	//		 |
	//		 ∏ *,inequality
	//		 |
	//       ⨝ swapped
	//     /   \ 
	//    B     W pk:row_number
	//          |
	//          P

	LogicalComparisonJoin join_op(InverseJoinType(op.join_type));

	join_op.types = op.children[1]->types;
	const auto &probe_types = op.children[0]->types;
	join_op.types.insert(join_op.types.end(), probe_types.begin(), probe_types.end());

	// TODO: We can't handle predicates right now because we would have to remap column references.
	if (op.predicate) {
		return nullptr;
	}

	//	Fill in the projection maps to simplify the code below
	//	Since NLJ doesn't support projection, but ASOF does,
	//	we have to track this carefully...
	join_op.left_projection_map = op.right_projection_map;
	if (join_op.left_projection_map.empty()) {
		for (idx_t i = 0; i < op.children[1]->types.size(); ++i) {
			join_op.left_projection_map.emplace_back(i);
		}
	}

	join_op.right_projection_map = op.left_projection_map;
	if (join_op.right_projection_map.empty()) {
		for (idx_t i = 0; i < op.children[0]->types.size(); ++i) {
			join_op.right_projection_map.emplace_back(i);
		}
	}

	// Project pk
	LogicalType pk_type = LogicalType::BIGINT;
	join_op.types.emplace_back(pk_type);

	auto binder = Binder::CreateBinder(context);
	FunctionBinder function_binder(*binder);
	auto asof_idx = op.conditions.size();
	string arg_min_max;
	for (idx_t i = 0; i < op.conditions.size(); ++i) {
		const auto &cond = op.conditions[i];
		JoinCondition nested_cond;
		nested_cond.left = cond.right->Copy();
		nested_cond.right = cond.left->Copy();
		if (!nested_cond.left || !nested_cond.right) {
			return nullptr;
		}
		nested_cond.comparison = FlipComparisonExpression(cond.comparison);
		join_op.conditions.emplace_back(std::move(nested_cond));
		switch (cond.comparison) {
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		case ExpressionType::COMPARE_GREATERTHAN:
			D_ASSERT(asof_idx == op.conditions.size());
			asof_idx = i;
			arg_min_max = "arg_max";
			break;
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		case ExpressionType::COMPARE_LESSTHAN:
			D_ASSERT(asof_idx == op.conditions.size());
			asof_idx = i;
			arg_min_max = "arg_min";
			break;
		default:
			break;
		}
	}

	//	NLJ does not support some join types
	switch (join_op.join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI:
	case JoinType::MARK:
	case JoinType::INNER:
	case JoinType::RIGHT:
		// Unfortunately, this does not check all the join types...
		if (!PhysicalNestedLoopJoin::IsSupported(op.conditions, op.join_type)) {
			return nullptr;
		}
		break;
	case JoinType::OUTER:
	case JoinType::LEFT:
		//	RIGHT ASOF JOINs produce the entire build table and would require grouping on all build rows,
		//	which defeats the purpose of this optimisation.
	default:
		return nullptr;
	}

	EntryLookupInfo function_lookup(CatalogType::SCALAR_FUNCTION_ENTRY, arg_min_max);
	auto arg_min_max_func =
	    binder->GetCatalogEntry(SYSTEM_CATALOG, DEFAULT_SCHEMA, function_lookup, OnEntryNotFound::RETURN_NULL);
	//	Can't find the arg_min/max aggregate we need, so give up before we break anything.
	if (!arg_min_max_func || arg_min_max_func->type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
		return nullptr;
	}
	auto &arg_min_max_entry = arg_min_max_func->Cast<AggregateFunctionCatalogEntry>();

	// PhysicalHashAggregate requires that the arguments to aggregate functions be bound references,
	// so we Project the (shared) ordering argument on the end of the join results.
	vector<unique_ptr<Expression>> comp_list;
	for (const auto &col_type : join_op.types) {
		const auto col_idx = comp_list.size();
		comp_list.emplace_back(make_uniq<BoundReferenceExpression>(col_type, col_idx));
	}
	vector<LogicalType> comp_types = join_op.types;
	auto comp_expr = op.conditions[asof_idx].right->Copy();
	comp_types.emplace_back(comp_expr->return_type);
	comp_list.emplace_back(std::move(comp_expr));

	//	Bind the aggregates first so we can abort safely if we can't find one.
	vector<LogicalType> aggr_types(1, pk_type);

	// Wrap all the projected non-pk probe fields in `first` aggregates;
	vector<unique_ptr<Expression>> aggregates;
	for (const auto &i : join_op.right_projection_map) {
		const auto col_idx = op.children[1]->types.size() + i;
		const auto col_type = join_op.types[col_idx];
		aggr_types.emplace_back(col_type);

		vector<unique_ptr<Expression>> aggr_children;
		auto col_ref = make_uniq<BoundReferenceExpression>(col_type, col_idx);
		aggr_children.push_back(std::move(col_ref));

		auto first_aggregate = FirstFunctionGetter::GetFunction(col_type);
		auto aggr_expr = make_uniq<BoundAggregateExpression>(std::move(first_aggregate), std::move(aggr_children),
		                                                     nullptr, nullptr, AggregateType::NON_DISTINCT);
		D_ASSERT(col_type == aggr_expr->return_type);
		aggregates.emplace_back(std::move(aggr_expr));
	}

	// Wrap all the projected build fields in `arg_max/min` aggregates using the inequality ordering;
	// We are doing all this first in case we can't find a matching function.
	for (const auto &col_idx : join_op.left_projection_map) {
		const auto col_type = join_op.types[col_idx];
		aggr_types.emplace_back(col_type);

		vector<unique_ptr<Expression>> aggr_children;
		auto col_ref = make_uniq<BoundReferenceExpression>(col_type, col_idx);
		aggr_children.push_back(std::move(col_ref));
		auto comp_expr = make_uniq<BoundReferenceExpression>(comp_types.back(), comp_types.size() - 1);
		aggr_children.push_back(std::move(comp_expr));
		vector<LogicalType> child_types;
		for (const auto &child : aggr_children) {
			child_types.emplace_back(child->return_type);
		}

		auto &func = arg_min_max_entry;
		ErrorData error;
		auto best_function = function_binder.BindFunction(func.name, func.functions, child_types, error);
		if (!best_function.IsValid()) {
			return nullptr;
		}
		auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());
		auto aggr_expr = function_binder.BindAggregateFunction(bound_function, std::move(aggr_children), nullptr,
		                                                       AggregateType::NON_DISTINCT);
		D_ASSERT(col_type == aggr_expr->return_type);
		aggregates.emplace_back(std::move(aggr_expr));
	}

	// Add a synthetic primary integer key to the probe relation using streaming windowing.
	vector<unique_ptr<Expression>> window_select;
	auto pk = make_uniq<BoundWindowExpression>(ExpressionType::WINDOW_ROW_NUMBER, pk_type, nullptr, nullptr);
	pk->start = WindowBoundary::UNBOUNDED_PRECEDING;
	pk->end = WindowBoundary::CURRENT_ROW_ROWS;
	pk->alias = "row_number";
	window_select.emplace_back(std::move(pk));

	auto window_types = probe.GetTypes();
	window_types.emplace_back(pk_type);

	idx_t probe_cardinality = op.children[0]->EstimateCardinality(context);
	auto &window = Make<PhysicalStreamingWindow>(window_types, std::move(window_select), probe_cardinality);
	window.children.emplace_back(probe);

	auto &join = Make<PhysicalNestedLoopJoin>(join_op, build, window, std::move(join_op.conditions), join_op.join_type,
	                                          probe_cardinality);

	// Plan a projection of the compare column
	auto &comp_proj = Make<PhysicalProjection>(std::move(comp_types), std::move(comp_list), probe_cardinality);
	comp_proj.children.emplace_back(join);

	// Plan an aggregation on the output of the join, grouping by key;
	// TODO: Can we make it perfect?
	// Note that the NLJ produced all fields, but only the projected ones were aggregated
	vector<unique_ptr<Expression>> groups;
	auto pk_ref = make_uniq<BoundReferenceExpression>(pk_type, join_op.types.size() - 1);
	groups.emplace_back(std::move(pk_ref));

	auto &aggr =
	    Make<PhysicalHashAggregate>(context, aggr_types, std::move(aggregates), std::move(groups), probe_cardinality);
	aggr.children.emplace_back(comp_proj);

	// Project away primary/grouping key
	// The aggregates were generated in the output order of the original ASOF,
	// so we just have to shift away the pk
	vector<unique_ptr<Expression>> project_list;
	for (column_t i = 1; i < aggr.GetTypes().size(); ++i) {
		auto col_ref = make_uniq<BoundReferenceExpression>(aggr.GetTypes()[i], i);
		project_list.emplace_back(std::move(col_ref));
	}

	auto &proj = Make<PhysicalProjection>(op.types, std::move(project_list), probe_cardinality);
	proj.children.emplace_back(aggr);
	return proj;
}